

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int x;
  int m;
  int n;
  Tree t2;
  Tree t1;
  int local_4c;
  int local_48;
  int local_44;
  Tree local_40;
  Tree local_30;
  
  local_30.mRoot = (Node *)0x0;
  local_30.mSize = 0;
  local_40.mRoot = (Node *)0x0;
  local_40.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_44);
  if (0 < local_44) {
    iVar3 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_4c);
      Tree::insertAt(&local_30,&local_30.mRoot,local_4c);
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_44);
  }
  std::istream::operator>>((istream *)&std::cin,&local_48);
  if (0 < local_48) {
    iVar3 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_4c);
      Tree::insertAt(&local_40,&local_40.mRoot,local_4c);
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_48);
  }
  if (local_30.mSize == local_40.mSize) {
    bVar1 = Tree::check(&local_30,local_30.mRoot,local_40.mRoot);
    if (bVar1) {
      lVar2 = 4;
      pcVar4 = "True";
      goto LAB_0010130e;
    }
  }
  lVar2 = 5;
  pcVar4 = "False";
LAB_0010130e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  Tree::clear(&local_40,&local_40.mRoot);
  Tree::clear(&local_30,&local_30.mRoot);
  return 0;
}

Assistant:

int main()
{
    Tree t1;
    Tree t2;
    int n, m, x;
    cin>>n;
    for (int i = 0; i < n; i++) {
        cin>>x;
        t1.insert(x);
    }
    cin>>m;
    for (int i = 0; i < m; i++) {
        cin>>x;
        t2.insert(x);
    }
    if (t1.isSameBinaryTree(t2)) {
        cout<<"True"<<endl;
    } else {
        cout<<"False"<<endl;
    }
    return 0;
}